

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

uint64 mkvmuxer::anon_unknown_0::WriteBlock
                 (IMkvWriter *writer,Frame *frame,int64 timecode,uint64 timecode_scale)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  uint8_t *puVar4;
  uint64_t uVar5;
  uint64 uVar6;
  uint64 uVar7;
  int64_t iVar8;
  ulong uVar9;
  ulong value;
  uint64 block_group_payload_size;
  uint64 block_elem_size;
  uint64 block_payload_size;
  uint64 block_duration_elem_size;
  uint64 duration;
  uint64 reference_block_elem_size;
  uint64 reference_block_timestamp;
  uint64 discard_padding_elem_size;
  uint64 block_additions_elem_size;
  uint64 block_additions_payload_size;
  uint64 block_more_elem_size;
  uint64 block_more_payload_size;
  uint64 block_addid_elem_size;
  uint64 block_additional_elem_size;
  uint64 timecode_scale_local;
  int64 timecode_local;
  Frame *frame_local;
  IMkvWriter *writer_local;
  
  block_more_elem_size = 0;
  block_additions_elem_size = 0;
  discard_padding_elem_size = 0;
  puVar4 = Frame::additional(frame);
  if (puVar4 != (uint8_t *)0x0) {
    puVar4 = Frame::additional(frame);
    uVar5 = Frame::additional_length(frame);
    uVar6 = EbmlElementSize(0xa5,puVar4,uVar5);
    uVar5 = Frame::add_id(frame);
    uVar7 = EbmlElementSize(0xee,uVar5);
    block_more_elem_size = uVar7 + uVar6;
    uVar6 = EbmlMasterElementSize(0xa6,block_more_elem_size);
    block_additions_elem_size = uVar6 + block_more_elem_size;
    uVar6 = EbmlMasterElementSize(0x75a1,block_additions_elem_size);
    discard_padding_elem_size = uVar6 + block_additions_elem_size;
  }
  reference_block_timestamp = 0;
  iVar8 = Frame::discard_padding(frame);
  if (iVar8 != 0) {
    iVar8 = Frame::discard_padding(frame);
    reference_block_timestamp = EbmlElementSize(0x75a2,iVar8);
  }
  uVar9 = Frame::reference_block_timestamp(frame);
  duration = 0;
  bVar1 = Frame::is_key(frame);
  if (!bVar1) {
    duration = EbmlElementSize(0xfb,uVar9 / timecode_scale);
  }
  uVar5 = Frame::duration(frame);
  value = uVar5 / timecode_scale;
  block_payload_size = 0;
  if (value != 0) {
    block_payload_size = EbmlElementSize(0x9b,value);
  }
  uVar5 = Frame::length(frame);
  uVar6 = uVar5 + 4;
  uVar7 = EbmlMasterElementSize(0xa1,uVar6);
  uVar7 = uVar7 + uVar6 + discard_padding_elem_size + block_payload_size + reference_block_timestamp
          + duration;
  bVar1 = WriteEbmlMasterElement(writer,0xa0,uVar7);
  if (bVar1) {
    bVar1 = WriteEbmlMasterElement(writer,0xa1,uVar6);
    if (bVar1) {
      uVar5 = Frame::track_number(frame);
      iVar2 = WriteUInt(writer,uVar5);
      if (iVar2 == 0) {
        iVar2 = SerializeInt(writer,timecode,2);
        if (iVar2 == 0) {
          iVar2 = SerializeInt(writer,0,1);
          if (iVar2 == 0) {
            puVar4 = Frame::frame(frame);
            uVar5 = Frame::length(frame);
            iVar3 = (**writer->_vptr_IMkvWriter)(writer,puVar4,uVar5 & 0xffffffff);
            if (iVar3 == 0) {
              puVar4 = Frame::additional(frame);
              if (puVar4 != (uint8_t *)0x0) {
                bVar1 = WriteEbmlMasterElement(writer,0x75a1,block_additions_elem_size);
                if (!bVar1) {
                  return 0;
                }
                bVar1 = WriteEbmlMasterElement(writer,0xa6,block_more_elem_size);
                if (!bVar1) {
                  return 0;
                }
                uVar5 = Frame::add_id(frame);
                bVar1 = WriteEbmlElement(writer,0xee,uVar5);
                if (!bVar1) {
                  return 0;
                }
                puVar4 = Frame::additional(frame);
                uVar5 = Frame::additional_length(frame);
                bVar1 = WriteEbmlElement(writer,0xa5,puVar4,uVar5);
                if (!bVar1) {
                  return 0;
                }
              }
              iVar8 = Frame::discard_padding(frame);
              if (iVar8 != 0) {
                iVar8 = Frame::discard_padding(frame);
                bVar1 = WriteEbmlElement(writer,0x75a2,iVar8);
                if (!bVar1) {
                  return 0;
                }
              }
              bVar1 = Frame::is_key(frame);
              if ((bVar1) || (bVar1 = WriteEbmlElement(writer,0xfb,uVar9 / timecode_scale), bVar1))
              {
                if ((value == 0) || (bVar1 = WriteEbmlElement(writer,0x9b,value), bVar1)) {
                  uVar6 = EbmlMasterElementSize(0xa0,uVar7);
                  writer_local = (IMkvWriter *)(uVar6 + uVar7);
                }
                else {
                  writer_local = (IMkvWriter *)0x0;
                }
              }
              else {
                writer_local = (IMkvWriter *)0x0;
              }
            }
            else {
              writer_local = (IMkvWriter *)0x0;
            }
          }
          else {
            writer_local = (IMkvWriter *)0x0;
          }
        }
        else {
          writer_local = (IMkvWriter *)0x0;
        }
      }
      else {
        writer_local = (IMkvWriter *)0x0;
      }
    }
    else {
      writer_local = (IMkvWriter *)0x0;
    }
  }
  else {
    writer_local = (IMkvWriter *)0x0;
  }
  return (uint64)writer_local;
}

Assistant:

uint64 WriteBlock(IMkvWriter* writer, const Frame* const frame, int64 timecode,
                  uint64 timecode_scale) {
  uint64 block_additional_elem_size = 0;
  uint64 block_addid_elem_size = 0;
  uint64 block_more_payload_size = 0;
  uint64 block_more_elem_size = 0;
  uint64 block_additions_payload_size = 0;
  uint64 block_additions_elem_size = 0;
  if (frame->additional()) {
    block_additional_elem_size =
        EbmlElementSize(libwebm::kMkvBlockAdditional, frame->additional(),
                        frame->additional_length());
    block_addid_elem_size = EbmlElementSize(
        libwebm::kMkvBlockAddID, static_cast<uint64>(frame->add_id()));

    block_more_payload_size =
        block_addid_elem_size + block_additional_elem_size;
    block_more_elem_size =
        EbmlMasterElementSize(libwebm::kMkvBlockMore, block_more_payload_size) +
        block_more_payload_size;
    block_additions_payload_size = block_more_elem_size;
    block_additions_elem_size =
        EbmlMasterElementSize(libwebm::kMkvBlockAdditions,
                              block_additions_payload_size) +
        block_additions_payload_size;
  }

  uint64 discard_padding_elem_size = 0;
  if (frame->discard_padding() != 0) {
    discard_padding_elem_size =
        EbmlElementSize(libwebm::kMkvDiscardPadding,
                        static_cast<int64>(frame->discard_padding()));
  }

  const uint64 reference_block_timestamp =
      frame->reference_block_timestamp() / timecode_scale;
  uint64 reference_block_elem_size = 0;
  if (!frame->is_key()) {
    reference_block_elem_size =
        EbmlElementSize(libwebm::kMkvReferenceBlock, reference_block_timestamp);
  }

  const uint64 duration = frame->duration() / timecode_scale;
  uint64 block_duration_elem_size = 0;
  if (duration > 0)
    block_duration_elem_size =
        EbmlElementSize(libwebm::kMkvBlockDuration, duration);

  const uint64 block_payload_size = 4 + frame->length();
  const uint64 block_elem_size =
      EbmlMasterElementSize(libwebm::kMkvBlock, block_payload_size) +
      block_payload_size;

  const uint64 block_group_payload_size =
      block_elem_size + block_additions_elem_size + block_duration_elem_size +
      discard_padding_elem_size + reference_block_elem_size;

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockGroup,
                              block_group_payload_size)) {
    return 0;
  }

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlock, block_payload_size))
    return 0;

  if (WriteUInt(writer, frame->track_number()))
    return 0;

  if (SerializeInt(writer, timecode, 2))
    return 0;

  // For a Block, flags is always 0.
  if (SerializeInt(writer, 0, 1))
    return 0;

  if (writer->Write(frame->frame(), static_cast<uint32>(frame->length())))
    return 0;

  if (frame->additional()) {
    if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockAdditions,
                                block_additions_payload_size)) {
      return 0;
    }

    if (!WriteEbmlMasterElement(writer, libwebm::kMkvBlockMore,
                                block_more_payload_size))
      return 0;

    if (!WriteEbmlElement(writer, libwebm::kMkvBlockAddID,
                          static_cast<uint64>(frame->add_id())))
      return 0;

    if (!WriteEbmlElement(writer, libwebm::kMkvBlockAdditional,
                          frame->additional(), frame->additional_length())) {
      return 0;
    }
  }

  if (frame->discard_padding() != 0 &&
      !WriteEbmlElement(writer, libwebm::kMkvDiscardPadding,
                        static_cast<int64>(frame->discard_padding()))) {
    return false;
  }

  if (!frame->is_key() && !WriteEbmlElement(writer, libwebm::kMkvReferenceBlock,
                                            reference_block_timestamp)) {
    return false;
  }

  if (duration > 0 &&
      !WriteEbmlElement(writer, libwebm::kMkvBlockDuration, duration)) {
    return false;
  }
  return EbmlMasterElementSize(libwebm::kMkvBlockGroup,
                               block_group_payload_size) +
         block_group_payload_size;
}